

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

void __thiscall geometrycentral::surface::SurfaceMesh::compressVertices(SurfaceMesh *this)

{
  pointer puVar1;
  size_t *x;
  pointer puVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *permNewToOld;
  _List_node_base *p_Var3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  permNewToOld = &local_68;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_30,this->nVerticesFillCount,&INVALID_IND,(allocator_type *)&local_68);
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (this->nVerticesFillCount != 0) {
    do {
      permNewToOld = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (this->vHalfedgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if ((&(permNewToOld->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start)
          [(long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start] != (pointer)0xffffffffffffffff) {
        permNewToOld = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ((long)local_48.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3);
        local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start
        [(long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start] = (unsigned_long)permNewToOld;
        if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_48,
                     (iterator)
                     local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_68);
        }
        else {
          *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (unsigned_long)
               local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_68.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
    } while (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start < (pointer)this->nVerticesFillCount);
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            (&local_68,(geometrycentral *)&this->vHalfedgeArr,&local_48,permNewToOld);
  puVar2 = (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (this->useImplicitTwinFlag == false) {
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              (&local_68,(geometrycentral *)&this->vHeInStartArr,&local_48,permNewToOld);
    puVar2 = (this->vHeInStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->vHeInStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->vHeInStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
    (this->vHeInStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
      if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              (&local_68,(geometrycentral *)&this->vHeOutStartArr,&local_48,permNewToOld);
    puVar2 = (this->vHeOutStartArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->vHeOutStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start =
         local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->vHeOutStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
    (this->vHeOutStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
      if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  puVar1 = (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->heVertexArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    if (*puVar2 != 0xffffffffffffffff) {
      *puVar2 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[*puVar2];
    }
  }
  this->nVerticesFillCount = this->nVerticesCount;
  this->nVerticesCapacityCount = this->nVerticesCount;
  p_Var3 = (_List_node_base *)&this->vertexPermuteCallbackList;
  while( true ) {
    p_Var3 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->vertexPermuteCallbackList) {
      if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    if (p_Var3[2]._M_next == (_List_node_base *)0x0) break;
    (*(code *)p_Var3[2]._M_prev)(p_Var3 + 1,&local_48);
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void SurfaceMesh::compressVertices() {
  // Build the compressing shift
  std::vector<size_t> newIndMap;                                  // maps new ind -> old ind
  std::vector<size_t> oldIndMap(nVerticesFillCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nVerticesFillCount; i++) {
    if (!vertexIsDead(i)) {
      oldIndMap[i] = newIndMap.size();
      newIndMap.push_back(i);
    }
  }


  // Permute & resize all per-vertex arrays
  vHalfedgeArr = applyPermutation(vHalfedgeArr, newIndMap);
  if (!usesImplicitTwin()) {
    vHeInStartArr = applyPermutation(vHeInStartArr, newIndMap);
    vHeOutStartArr = applyPermutation(vHeOutStartArr, newIndMap);
  }

  // Update indices in all vertex-valued arrays
  updateValues(heVertexArr, oldIndMap);

  // Update counts
  nVerticesFillCount = nVerticesCount;
  nVerticesCapacityCount = nVerticesCount;

  // Invoke callbacks
  for (auto& f : vertexPermuteCallbackList) {
    f(newIndMap);
  }
}